

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int patternTest(char *filename,char *resul,char *err,int options)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar5;
  long lVar6;
  xmlPatternPtr patternc_00;
  xmlTextReaderPtr reader_00;
  bool bVar7;
  undefined8 *local_948;
  xmlNsPtr ns;
  int j;
  xmlChar *namespaces [22];
  xmlNodePtr root;
  xmlDocPtr doc;
  xmlTextReaderPtr reader;
  char *temp;
  int res;
  int ret;
  int i;
  int len;
  char result [500];
  char local_658 [4];
  undefined1 auStack_654 [4];
  char xml [500];
  char local_458 [8];
  char str [1024];
  FILE *f;
  FILE *o;
  xmlStreamCtxtPtr patstream;
  xmlPatternPtr patternc;
  int options_local;
  char *err_local;
  char *resul_local;
  char *filename_local;
  
  sVar3 = strlen(filename);
  iVar1 = (int)sVar3 + -4;
  memcpy(local_658,filename,(long)iVar1);
  local_658[iVar1] = '\0';
  pcVar4 = baseFilename(local_658);
  iVar2 = snprintf((char *)&i,499,"result/pattern/%s",pcVar4);
  if (0x1f2 < iVar2) {
    result[0x1eb] = '\0';
  }
  builtin_strncpy(local_658 + iVar1,".xml",4);
  auStack_654[iVar1] = 0;
  iVar1 = checkTestFile(local_658);
  if ((iVar1 == 0) && (update_results == 0)) {
    fprintf(_stderr,"Missing xml file %s\n",local_658);
    filename_local._4_4_ = -1;
  }
  else {
    __stream = fopen64(filename,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"Failed to open %s\n",filename);
      filename_local._4_4_ = -1;
    }
    else {
      pcVar4 = resultFilename(filename,temp_directory,".res");
      if (pcVar4 == (char *)0x0) {
        fprintf(_stderr,"Out of memory\n");
        fatalError();
      }
      __stream_00 = fopen64(pcVar4,"wb");
      if (__stream_00 == (FILE *)0x0) {
        fprintf(_stderr,"failed to open output file %s\n",pcVar4);
        fclose(__stream);
        free(pcVar4);
        filename_local._4_4_ = -1;
      }
      else {
        while (pcVar5 = fgets(local_458,0x3ff,__stream), pcVar5 != (char *)0x0) {
          sVar3 = strlen(local_458);
          res = (int)sVar3;
          while( true ) {
            bVar7 = false;
            if ((((0 < res) && (bVar7 = true, local_458[res + -1] != '\n')) &&
                (bVar7 = true, local_458[res + -1] != '\r')) &&
               (bVar7 = true, local_458[res + -1] != ' ')) {
              bVar7 = local_458[res + -1] == '\t';
            }
            if (!bVar7) break;
            res = res + -1;
            local_458[res] = '\0';
          }
          lVar6 = xmlReadFile(local_658,0,options);
          if (lVar6 == 0) {
            fprintf(_stderr,"Failed to parse %s\n",local_658);
          }
          else {
            namespaces[0x15] = (xmlChar *)xmlDocGetRootElement(lVar6);
            local_948 = *(undefined8 **)(namespaces[0x15] + 0x60);
            ns._4_4_ = 0;
            for (; local_948 != (undefined8 *)0x0 && ns._4_4_ < 0x14;
                local_948 = (undefined8 *)*local_948) {
              iVar1 = ns._4_4_ + 1;
              namespaces[(long)ns._4_4_ + -1] = (xmlChar *)local_948[2];
              ns._4_4_ = ns._4_4_ + 2;
              namespaces[(long)iVar1 + -1] = (xmlChar *)local_948[3];
            }
            namespaces[(long)ns._4_4_ + -1] = (xmlChar *)0x0;
            namespaces[(long)(ns._4_4_ + 1) + -1] = (xmlChar *)0x0;
            patternc_00 = (xmlPatternPtr)
                          xmlPatterncompile(local_458,*(undefined8 *)(lVar6 + 0x98),0,
                                            &stack0xfffffffffffff6c8);
            if (patternc_00 == (xmlPatternPtr)0x0) {
              testErrorHandler((void *)0x0,"Pattern %s failed to compile\n",local_458);
              xmlFreeDoc(lVar6);
            }
            else {
              o = (FILE *)xmlPatternGetStreamCtxt(patternc_00);
              if ((o != (FILE *)0x0) && (iVar1 = xmlStreamPush(o,0), iVar1 < 0)) {
                fprintf(_stderr,"xmlStreamPush() failure\n");
                xmlFreeStreamCtxt(o);
                o = (FILE *)0x0;
              }
              nb_tests = nb_tests + 1;
              reader_00 = (xmlTextReaderPtr)xmlReaderWalker(lVar6);
              temp._0_4_ = xmlTextReaderRead(reader_00);
              while ((int)temp == 1) {
                patternNode((FILE *)__stream_00,reader_00,local_458,patternc_00,(xmlStreamCtxtPtr)o)
                ;
                temp._0_4_ = xmlTextReaderRead(reader_00);
              }
              if ((int)temp != 0) {
                fprintf(__stream_00,"%s : failed to parse\n",filename);
              }
              xmlFreeTextReader(reader_00);
              xmlFreeDoc(lVar6);
              xmlFreeStreamCtxt(o);
              xmlFreePattern(patternc_00);
            }
          }
        }
        fclose(__stream);
        fclose(__stream_00);
        temp._4_4_ = compareFiles(pcVar4,(char *)&i);
        if (temp._4_4_ != 0) {
          fprintf(_stderr,"Result for %s failed in %s\n",filename,&i);
          temp._4_4_ = 1;
        }
        if (pcVar4 != (char *)0x0) {
          unlink(pcVar4);
          free(pcVar4);
        }
        filename_local._4_4_ = temp._4_4_;
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
patternTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *err ATTRIBUTE_UNUSED,
            int options) {
    xmlPatternPtr patternc = NULL;
    xmlStreamCtxtPtr patstream = NULL;
    FILE *o, *f;
    char str[1024];
    char xml[500];
    char result[500];
    int len, i;
    int ret = 0, res;
    char *temp;
    xmlTextReaderPtr reader;
    xmlDocPtr doc;

    len = strlen(filename);
    len -= 4;
    memcpy(xml, filename, len);
    xml[len] = 0;
    if (snprintf(result, 499, "result/pattern/%s", baseFilename(xml)) >= 499)
        result[499] = 0;
    memcpy(xml + len, ".xml", 5);

    if (!checkTestFile(xml) && !update_results) {
	fprintf(stderr, "Missing xml file %s\n", xml);
	return(-1);
    }
    f = fopen(filename, "rb");
    if (f == NULL) {
        fprintf(stderr, "Failed to open %s\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    o = fopen(temp, "wb");
    if (o == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
	fclose(f);
        free(temp);
	return(-1);
    }
    while (1) {
	/*
	 * read one line in string buffer.
	 */
	if (fgets (&str[0], sizeof (str) - 1, f) == NULL)
	   break;

	/*
	 * remove the ending spaces
	 */
	i = strlen(str);
	while ((i > 0) &&
	       ((str[i - 1] == '\n') || (str[i - 1] == '\r') ||
		(str[i - 1] == ' ') || (str[i - 1] == '\t'))) {
	    i--;
	    str[i] = 0;
	}
	doc = xmlReadFile(xml, NULL, options);
	if (doc == NULL) {
	    fprintf(stderr, "Failed to parse %s\n", xml);
	    ret = 1;
	} else {
	    xmlNodePtr root;
	    const xmlChar *namespaces[22];
	    int j;
	    xmlNsPtr ns;

	    root = xmlDocGetRootElement(doc);
	    for (ns = root->nsDef, j = 0;ns != NULL && j < 20;ns=ns->next) {
		namespaces[j++] = ns->href;
		namespaces[j++] = ns->prefix;
	    }
	    namespaces[j++] = NULL;
	    namespaces[j] = NULL;

	    patternc = xmlPatterncompile((const xmlChar *) str, doc->dict,
					 0, &namespaces[0]);
	    if (patternc == NULL) {
		testErrorHandler(NULL,
			"Pattern %s failed to compile\n", str);
		xmlFreeDoc(doc);
		ret = 1;
		continue;
	    }
	    patstream = xmlPatternGetStreamCtxt(patternc);
	    if (patstream != NULL) {
		ret = xmlStreamPush(patstream, NULL, NULL);
		if (ret < 0) {
		    fprintf(stderr, "xmlStreamPush() failure\n");
		    xmlFreeStreamCtxt(patstream);
		    patstream = NULL;
		}
	    }
	    nb_tests++;

	    reader = xmlReaderWalker(doc);
	    res = xmlTextReaderRead(reader);
	    while (res == 1) {
		patternNode(o, reader, str, patternc, patstream);
		res = xmlTextReaderRead(reader);
	    }
	    if (res != 0) {
		fprintf(o, "%s : failed to parse\n", filename);
	    }
	    xmlFreeTextReader(reader);
	    xmlFreeDoc(doc);
	    xmlFreeStreamCtxt(patstream);
	    patstream = NULL;
	    xmlFreePattern(patternc);

	}
    }

    fclose(f);
    fclose(o);

    ret = compareFiles(temp, result);
    if (ret) {
	fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	ret = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(ret);
}